

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libretro_main.c
# Opt level: O1

void retro_get_system_info(retro_system_info *info)

{
  info->library_name = (char *)0x0;
  info->library_version = (char *)0x0;
  info->valid_extensions = (char *)0x0;
  info->need_fullpath = false;
  info->block_extract = false;
  *(undefined6 *)&info->field_0x1a = 0;
  info->library_name = "gb";
  info->library_version = "0.93";
  info->need_fullpath = true;
  info->block_extract = false;
  info->valid_extensions = "gb";
  return;
}

Assistant:

void retro_get_system_info(struct retro_system_info *info)
{
   memset(info, 0, sizeof(struct retro_system_info));
   info->library_name     = "gb";
   info->library_version  = "0.93";
   info->need_fullpath    = true;
   info->block_extract    = false;
   info->valid_extensions = "gb";
}